

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

int xmlwrite_string(archive_write *a,xml_writer *writer,char *key,char *value)

{
  uint uVar1;
  char *fmt;
  int iVar2;
  
  iVar2 = 0;
  if (value != (char *)0x0) {
    uVar1 = xmlTextWriterStartElement(writer->writer,key);
    if ((int)uVar1 < 0) {
      fmt = "xml_writer_start_element() failed: %d";
    }
    else {
      uVar1 = xmlTextWriterWriteString(writer->writer,value);
      if ((int)uVar1 < 0) {
        fmt = "xml_writer_write_string() failed: %d";
      }
      else {
        uVar1 = xmlTextWriterEndElement(writer->writer);
        if (-1 < (int)uVar1) {
          return 0;
        }
        fmt = "xml_writer_end_element() failed: %d";
      }
    }
    archive_set_error(&a->archive,-1,fmt,(ulong)uVar1);
    iVar2 = -0x1e;
  }
  return iVar2;
}

Assistant:

static int
xmlwrite_string(struct archive_write *a, struct xml_writer *writer,
	const char *key, const char *value)
{
	int r;

	if (value == NULL)
		return (ARCHIVE_OK);

	r = xml_writer_start_element(writer, key);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_start_element() failed: %d", r);
		return (ARCHIVE_FATAL);
	}
	if (value != NULL) {
		r = xml_writer_write_string(writer, value);
		if (r < 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "xml_writer_write_string() failed: %d", r);
			return (ARCHIVE_FATAL);
		}
	}
	r = xml_writer_end_element(writer);
	if (r < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_MISC,
		    "xml_writer_end_element() failed: %d", r);
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}